

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.h
# Opt level: O3

void __thiscall
cnn::Model::save<boost::archive::text_oarchive>(Model *this,text_oarchive *ar,uint param_2)

{
  Parameters *pPVar1;
  LookupParameters *pLVar2;
  bool bVar3;
  pointer ppPVar4;
  pointer ppLVar5;
  ulong uVar6;
  ulong uVar7;
  int nlp;
  int np;
  undefined8 local_28;
  
  local_28 = CONCAT44((int)((ulong)((long)(this->params).
                                          super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->params).
                                         super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3),
                      (int)((ulong)((long)(this->lookup_params).
                                          super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->lookup_params).
                                         super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3));
  boost::archive::save_access::save_primitive<boost::archive::text_oarchive,int>
            (ar,(int *)((long)&local_28 + 4));
  boost::archive::save_access::save_primitive<boost::archive::text_oarchive,int>
            (ar,(int *)&local_28);
  ppPVar4 = (this->params).super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->params).super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppPVar4) {
    uVar6 = 0;
    uVar7 = 1;
    do {
      pPVar1 = ppPVar4[uVar6];
      boost::serialization::
      singleton<boost::archive::detail::oserializer<boost::archive::text_oarchive,_cnn::Parameters>_>
      ::get_instance();
      boost::archive::detail::basic_oarchive::save_object(ar,(basic_oserializer *)pPVar1);
      ppPVar4 = (this->params).
                super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      bVar3 = uVar7 < (ulong)((long)(this->params).
                                    super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar4 >> 3)
      ;
      uVar6 = uVar7;
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (bVar3);
  }
  ppLVar5 = (this->lookup_params).
            super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->lookup_params).
      super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppLVar5) {
    uVar6 = 0;
    uVar7 = 1;
    do {
      pLVar2 = ppLVar5[uVar6];
      boost::serialization::
      singleton<boost::archive::detail::oserializer<boost::archive::text_oarchive,_cnn::LookupParameters>_>
      ::get_instance();
      boost::archive::detail::basic_oarchive::save_object(ar,(basic_oserializer *)pLVar2);
      ppLVar5 = (this->lookup_params).
                super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      bVar3 = uVar7 < (ulong)((long)(this->lookup_params).
                                    super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar5 >> 3)
      ;
      uVar6 = uVar7;
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (bVar3);
  }
  return;
}

Assistant:

void save(Archive& ar, const unsigned int) const {
    int np = params.size();
    int nlp = lookup_params.size();
    ar & np;
    ar & nlp;
    for (unsigned i = 0; i < params.size(); ++i)
      ar & *params[i];
    for (unsigned i = 0; i < lookup_params.size(); ++i)
      ar & *lookup_params[i];
  }